

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

bool __thiscall CConsole::LineIsValid(CConsole *this,char *pStr)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffeadc;
  char *in_stack_ffffffffffffeae0;
  undefined2 in_stack_ffffffffffffeae8;
  undefined1 in_stack_ffffffffffffeaea;
  undefined1 in_stack_ffffffffffffeaeb;
  int in_stack_ffffffffffffeaec;
  CResult *in_stack_ffffffffffffeaf0;
  undefined4 in_stack_ffffffffffffeaf8;
  int in_stack_ffffffffffffeafc;
  CCommand *pCommand;
  char *in_stack_ffffffffffffeb18;
  int InString;
  char *pNextPart;
  char *pEnd;
  char *pStr_local;
  CConsole *this_local;
  byte local_14b1;
  CResult Result;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (pStr == (char *)0x0) {
    local_14b1 = 0;
  }
  else if ((*pStr == '#') || (pStr_local = pStr, *pStr == '\0')) {
    local_14b1 = 1;
  }
  else {
    do {
      CResult::CResult(in_stack_ffffffffffffeaf0);
      pNextPart = (char *)0x0;
      bVar2 = false;
      for (pEnd = pStr_local; *pEnd != '\0'; pEnd = pEnd + 1) {
        if (*pEnd == '\"') {
          bVar2 = (bool)(bVar2 ^ 1);
        }
        else if (*pEnd == '\\') {
          if (pEnd[1] == '\"') {
            pEnd = pEnd + 1;
          }
        }
        else if (!bVar2) {
          if (*pEnd == ';') {
            pNextPart = pEnd + 1;
            break;
          }
          if (*pEnd == '#') break;
        }
      }
      in_stack_ffffffffffffeafc =
           ParseStart(this,(CResult *)CONCAT44(in_stack_ffffffffffffeafc,in_stack_ffffffffffffeaf8),
                      (char *)in_stack_ffffffffffffeaf0,in_stack_ffffffffffffeaec);
      if (in_stack_ffffffffffffeafc == 0) {
        in_stack_ffffffffffffeaf0 =
             (CResult *)
             FindCommand((CConsole *)
                         CONCAT44(in_stack_ffffffffffffeaec,
                                  CONCAT13(in_stack_ffffffffffffeaeb,
                                           CONCAT12(in_stack_ffffffffffffeaea,
                                                    in_stack_ffffffffffffeae8))),
                         in_stack_ffffffffffffeae0,in_stack_ffffffffffffeadc);
        if ((in_stack_ffffffffffffeaf0 == (CResult *)0x0) ||
           (in_stack_ffffffffffffeaec =
                 ParseArgs((CConsole *)in_stack_ffffffffffffeaf0,(CResult *)this,
                           in_stack_ffffffffffffeb18), in_stack_ffffffffffffeaec != 0)) {
          local_14b1 = 0;
          bVar2 = true;
        }
        else {
          pStr_local = pNextPart;
          bVar2 = false;
        }
      }
      else {
        local_14b1 = 0;
        bVar2 = true;
      }
      CResult::~CResult((CResult *)0x13b5ad);
      if (bVar2) goto LAB_0013b5e9;
      in_stack_ffffffffffffeaeb = false;
      if (pStr_local != (char *)0x0) {
        in_stack_ffffffffffffeaeb = *pStr_local != '\0';
      }
    } while ((bool)in_stack_ffffffffffffeaeb != false);
    local_14b1 = 1;
  }
LAB_0013b5e9:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(local_14b1 & 1);
}

Assistant:

bool CConsole::LineIsValid(const char *pStr)
{
	if(!pStr)
		return false;

	// Comments and empty lines are valid commands
	if(*pStr == '#' || *pStr == '\0')
		return true;

	do
	{
		CResult Result;
		const char *pEnd = pStr;
		const char *pNextPart = 0;
		int InString = 0;

		while(*pEnd)
		{
			if(*pEnd == '"')
				InString ^= 1;
			else if(*pEnd == '\\') // escape sequences
			{
				if(pEnd[1] == '"')
					pEnd++;
			}
			else if(!InString)
			{
				if(*pEnd == ';') // command separator
				{
					pNextPart = pEnd+1;
					break;
				}
				else if(*pEnd == '#') // comment, no need to do anything more
					break;
			}

			pEnd++;
		}

		if(ParseStart(&Result, pStr, (pEnd-pStr) + 1) != 0)
			return false;

		CCommand *pCommand = FindCommand(Result.m_pCommand, m_FlagMask);
		if(!pCommand || ParseArgs(&Result, pCommand->m_pParams))
			return false;

		pStr = pNextPart;
	}
	while(pStr && *pStr);

	return true;
}